

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall
QActionPrivate::setShortcutEnabled(QActionPrivate *this,bool enable,QShortcutMap *map)

{
  int id;
  long lVar1;
  QObject *owner;
  int *piVar2;
  long lVar3;
  long in_FS_OFFSET;
  QKeySequence local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->shortcutIds).d.size;
  if (lVar1 != 0) {
    owner = *(QObject **)&this->field_0x8;
    piVar2 = (this->shortcutIds).d.ptr;
    lVar3 = 0;
    do {
      id = *(int *)((long)piVar2 + lVar3);
      if (id != 0) {
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::setShortcutEnabled(map,enable,id,owner,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
      lVar3 = lVar3 + 4;
    } while (lVar1 << 2 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QActionPrivate::setShortcutEnabled(bool enable, QShortcutMap &map)
{
    Q_Q(QAction);
    for (int id : std::as_const(shortcutIds)) {
        if (id)
            map.setShortcutEnabled(enable, id, q);
    }
}